

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

size_t quantize_iq3_s(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  uint8_t *block_signs_00;
  long in_RCX;
  long in_RDX;
  int64_t row;
  char *qrow;
  uint8_t block_signs [4];
  _Bool is_on_grid_aux [8];
  _Bool is_on_grid [8];
  float waux [32];
  int8_t Laux [32];
  int8_t L [32];
  float xval [32];
  float weight [32];
  float scales [8];
  int64_t nblock;
  long local_260;
  float *in_stack_ffffffffffffff38;
  float *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  void *in_stack_ffffffffffffff50;
  float *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  float *in_stack_ffffffffffffff70;
  float *in_stack_ffffffffffffff78;
  int8_t *in_stack_ffffffffffffff80;
  int8_t *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  _Bool *in_stack_ffffffffffffff98;
  _Bool *in_stack_ffffffffffffffa0;
  
  if (in_RCX % 0x100 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,0xf7a,"GGML_ASSERT(%s) failed","n_per_row%QK_K == 0");
  }
  block_signs_00 = (uint8_t *)(in_RCX / 0x100);
  for (local_260 = 0; local_260 < in_RDX; local_260 = local_260 + 1) {
    quantize_row_iq3_s_impl
              (in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffffa0,block_signs_00);
  }
  return in_RDX * (long)block_signs_00 * 0x6e;
}

Assistant:

size_t quantize_iq3_s(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    int64_t nblock = n_per_row/QK_K;
    float scales[QK_K/IQ3S_BLOCK_SIZE];
    float weight[IQ3S_BLOCK_SIZE];
    float xval[IQ3S_BLOCK_SIZE];
    int8_t L[IQ3S_BLOCK_SIZE];
    int8_t Laux[IQ3S_BLOCK_SIZE];
    float  waux[IQ3S_BLOCK_SIZE];
    bool   is_on_grid[IQ3S_BLOCK_SIZE/4];
    bool   is_on_grid_aux[IQ3S_BLOCK_SIZE/4];
    uint8_t block_signs[IQ3S_BLOCK_SIZE/8];
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq3_s_impl(IQ3S_BLOCK_SIZE, src, qrow, n_per_row, quant_weights,
                scales, weight, xval, L, Laux, waux, is_on_grid, is_on_grid_aux, block_signs);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq3_s);
    }
    return nrow * nblock * sizeof(block_iq3_s);
}